

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraSublimeTextGenerator::CreateNewProjectFile
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  cmMakefile *mf;
  bool bVar1;
  cmSystemTools *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  char *in_RCX;
  MapSourceFileFlags sourceFileFlags;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  cmGeneratedFileStream fout;
  
  mf = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,(filename->_M_dataplus)._M_p,false);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) != 0) goto LAB_0034f14d;
  pcVar2 = (cmSystemTools *)
           cmLocalGenerator::GetBinaryDirectory
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  pcVar3 = cmLocalGenerator::GetSourceDirectory
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  cmSystemTools::RelativePath_abi_cxx11_(&local_2b0,pcVar2,pcVar3,in_RCX);
  std::operator<<((ostream *)&fout,"{\n");
  std::operator<<((ostream *)&fout,"\t\"folders\":\n\t[\n\t");
  if (local_2b0._M_string_length == 0) {
    std::operator<<((ostream *)&fout,"\t{\n\t\t\t\"path\": \"./\"");
  }
  else {
    poVar4 = std::operator<<((ostream *)&fout,"\t{\n\t\t\t\"path\": \"");
    poVar4 = std::operator<<(poVar4,(string *)&local_2b0);
    std::operator<<(poVar4,"\"");
    pcVar2 = (cmSystemTools *)
             cmLocalGenerator::GetSourceDirectory
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    pcVar3 = cmLocalGenerator::GetBinaryDirectory
                       (*(lgs->
                         super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    cmSystemTools::RelativePath_abi_cxx11_((string *)&sourceFileFlags,pcVar2,pcVar3,in_RCX);
    if (CONCAT44(sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                 sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_color) != 0) {
      if (2 < CONCAT44(sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                       sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_color)) {
        std::__cxx11::string::substr((ulong)&local_290,(ulong)&sourceFileFlags);
        bVar1 = std::operator!=(&local_290,"../");
        std::__cxx11::string::~string((string *)&local_290);
        if (!bVar1) goto LAB_0034f095;
      }
      poVar4 = std::operator<<((ostream *)&fout,",\n\t\t\t\"folder_exclude_patterns\": [\"");
      poVar4 = std::operator<<(poVar4,(string *)&sourceFileFlags);
      std::operator<<(poVar4,"\"]");
    }
LAB_0034f095:
    std::__cxx11::string::~string((string *)&sourceFileFlags);
  }
  std::operator<<((ostream *)&fout,"\n\t\t}");
  std::operator<<((ostream *)&fout,"\n\t]");
  std::operator<<((ostream *)&fout,",\n\t\"build_systems\":\n\t[\n\t");
  sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header;
  sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sourceFileFlags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  AppendAllTargets(this,lgs,mf,&fout,&sourceFileFlags);
  std::operator<<((ostream *)&fout,"\n\t]");
  std::operator<<((ostream *)&fout,"\n\t}");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&sourceFileFlags._M_t);
  std::__cxx11::string::~string((string *)&local_2b0);
LAB_0034f14d:
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator
  ::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                         const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  const std::string &sourceRootRelativeToOutput = cmSystemTools::RelativePath(
                     lgs[0]->GetBinaryDirectory(),
                     lgs[0]->GetSourceDirectory());
  // Write the folder entries to the project file
  fout << "{\n";
  fout << "\t\"folders\":\n\t[\n\t";
  if (!sourceRootRelativeToOutput.empty())
    {
      fout << "\t{\n\t\t\t\"path\": \"" << sourceRootRelativeToOutput << "\"";
      const std::string &outputRelativeToSourceRoot =
        cmSystemTools::RelativePath(lgs[0]->GetSourceDirectory(),
                                    lgs[0]->GetBinaryDirectory());
      if ((!outputRelativeToSourceRoot.empty()) &&
        ((outputRelativeToSourceRoot.length() < 3) ||
          (outputRelativeToSourceRoot.substr(0, 3) != "../")))
        {
        fout << ",\n\t\t\t\"folder_exclude_patterns\": [\"" <<
                outputRelativeToSourceRoot << "\"]";
        }
    }
  else
    {
      fout << "\t{\n\t\t\t\"path\": \"./\"";
    }
  fout << "\n\t\t}";
  // End of the folders section
  fout << "\n\t]";

  // Write the beginning of the build systems section to the project file
  fout << ",\n\t\"build_systems\":\n\t[\n\t";

  // Set of include directories over all targets (sublime text/sublimeclang
  // doesn't currently support these settings per build system, only project
  // wide
  MapSourceFileFlags sourceFileFlags;
  AppendAllTargets(lgs, mf, fout, sourceFileFlags);

  // End of build_systems
  fout << "\n\t]";
  fout << "\n\t}";
}